

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsmfrontalanal.cpp
# Opt level: O0

void __thiscall TPZSubMeshFrontalAnalysis::Run(TPZSubMeshFrontalAnalysis *this,ostream *out)

{
  int iVar1;
  TPZBaseMatrix *pTVar2;
  TPZFMatrix<double> *pTVar3;
  TPZMatrix<double> *pTVar4;
  long *in_RDI;
  TPZFMatrix<double> *rhs_1;
  TPZFMatrix<double> *rhs;
  TPZAutoPointer<TPZMatrix<double>_> solverMat;
  size_t in_stack_00000388;
  char *in_stack_00000390;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  TPZSolutionMatrix *in_stack_ffffffffffffff70;
  TPZSolutionMatrix *in_stack_ffffffffffffff78;
  TPZLinearAnalysis *in_stack_ffffffffffffff80;
  TPZAutoPointer<TPZMatrix<double>_> local_18 [3];
  
  TPZSolutionMatrix::operator=(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  (**(code **)(*in_RDI + 0x48))();
  TPZLinearAnalysis::MatrixSolver<double>(in_stack_ffffffffffffff80);
  TPZMatrixSolver<double>::Matrix
            ((TPZMatrixSolver<double> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  pTVar2 = &TPZAutoPointer<TPZMatrix<double>_>::operator->(local_18)->super_TPZBaseMatrix;
  iVar1 = TPZBaseMatrix::IsDecomposed(pTVar2);
  if (iVar1 == 1) {
    pTVar3 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_stack_ffffffffffffff70);
    pTVar4 = TPZAutoPointer<TPZMatrix<double>_>::operator->(local_18);
    (*(pTVar4->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x44])(pTVar4,pTVar3);
  }
  else {
    pTVar2 = &TPZAutoPointer<TPZMatrix<double>_>::operator->(local_18)->super_TPZBaseMatrix;
    iVar1 = TPZBaseMatrix::IsDecomposed(pTVar2);
    if (iVar1 == 3) {
      pTVar3 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_stack_ffffffffffffff70);
      pTVar4 = TPZAutoPointer<TPZMatrix<double>_>::operator->(local_18);
      (*(pTVar4->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x44])(pTVar4,pTVar3);
    }
    else {
      in_stack_ffffffffffffff70 =
           (TPZSolutionMatrix *)TPZAutoPointer<TPZMatrix<double>_>::operator->(local_18);
      iVar1 = TPZBaseMatrix::IsDecomposed((TPZBaseMatrix *)in_stack_ffffffffffffff70);
      if (iVar1 == 4) {
        std::operator<<((ostream *)&std::cerr,
                        "virtual void TPZSubMeshFrontalAnalysis::Run(std::ostream &)");
        std::operator<<((ostream *)&std::cerr,": dont know what to do...\n");
        pzinternal::DebugStopImpl(in_stack_00000390,in_stack_00000388);
      }
    }
  }
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_ffffffffffffff70);
  return;
}

Assistant:

void TPZSubMeshFrontalAnalysis::Run(std::ostream &out){
	
	//fReducableStiff.Print("Reducable stiff before assembled");
    //TODOCOMPLEX
	fReferenceSolution = fSolution;
	Assemble();
    auto solverMat = MatrixSolver<STATE>().Matrix();
	//    fSolver->Solve(fRhs, fRhs);
    if(solverMat->IsDecomposed() == ELU)
    {
        TPZFMatrix<STATE> &rhs = fRhs;
        solverMat->Subst_Forward(&rhs);
    } else if(solverMat->IsDecomposed() == ECholesky)
    {
        TPZFMatrix<STATE> &rhs = fRhs;
        solverMat->Subst_Forward(&rhs);
    } else if(solverMat->IsDecomposed() == ELDLt)
    {
        PZError << __PRETTY_FUNCTION__;
        PZError << ": dont know what to do...\n";
        DebugStop();
    }    
}